

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O2

Wlc_Ntk_t * Wlc_NtkDupSingleNodes(Wlc_Ntk_t *p)

{
  ushort uVar1;
  int iVar2;
  int Id;
  Vec_Int_t *p_00;
  Wlc_Ntk_t *pNew;
  Wlc_Obj_t *pWVar3;
  Wlc_Obj_t *pWVar4;
  char *pcVar5;
  int iVar6;
  int iVar7;
  
  for (iVar6 = 1; iVar6 < p->iObj; iVar6 = iVar6 + 1) {
    Wlc_NtkObj(p,iVar6);
  }
  Wlc_NtkCleanCopy(p);
  p_00 = Vec_IntAlloc(100);
  pNew = Wlc_NtkAlloc(p->pName,p->nObjsAlloc);
  iVar6 = p->fAsyncRst;
  iVar7 = p->fMemPorts;
  iVar2 = p->fEasyFfs;
  pNew->fSmtLib = p->fSmtLib;
  pNew->fAsyncRst = iVar6;
  pNew->fMemPorts = iVar7;
  pNew->fEasyFfs = iVar2;
  for (iVar6 = 1; iVar6 < p->iObj; iVar6 = iVar6 + 1) {
    pWVar3 = Wlc_NtkObj(p,iVar6);
    if ((((*(ushort *)pWVar3 & 0x3d) != 1) && (uVar1 = *(ushort *)pWVar3 & 0x3f, uVar1 != 0x2d)) &&
       ((uVar1 != 8 || ((int)pWVar3->nFanins < 4)))) {
      for (iVar7 = 0; iVar7 < (int)pWVar3->nFanins; iVar7 = iVar7 + 1) {
        iVar2 = Wlc_ObjFaninId(pWVar3,iVar7);
        pWVar4 = Wlc_NtkObj(p,iVar2);
        Id = Wlc_ObjAlloc(pNew,1,*(uint *)pWVar4 >> 6 & 1,pWVar4->End,pWVar4->Beg);
        Wlc_NtkObj(pNew,Id);
        Vec_IntWriteEntry(&p->vCopies,iVar2,Id);
      }
      iVar7 = Wlc_ObjDup(pNew,p,iVar6,p_00);
      pWVar3 = Wlc_NtkObj(pNew,iVar7);
      pWVar3->field_0x1 = pWVar3->field_0x1 | 2;
      Vec_IntPush(&pNew->vPos,iVar7);
    }
  }
  Vec_IntFree(p_00);
  Wlc_NtkTransferNames(pNew,p);
  if (p->pSpec != (char *)0x0) {
    pcVar5 = Abc_UtilStrsav(p->pSpec);
    pNew->pSpec = pcVar5;
  }
  return pNew;
}

Assistant:

Wlc_Ntk_t * Wlc_NtkDupSingleNodes( Wlc_Ntk_t * p )
{
    Wlc_Ntk_t * pNew;
    Vec_Int_t * vFanins;
    Wlc_Obj_t * pObj, * pObjNew;
    Wlc_Obj_t * pFanin, * pFaninNew;
    int i, k, iFanin, iFaninNew, iObjNew, Count = 0;
    // count objects
    Wlc_NtkForEachObj( p, pObj, i )
        if ( !Wlc_ObjIsCi(pObj) )
            Count += 1 + Wlc_ObjFaninNum(pObj);
    // copy objects
    Wlc_NtkCleanCopy( p );
    vFanins = Vec_IntAlloc( 100 );
    pNew = Wlc_NtkAlloc( p->pName, p->nObjsAlloc );
    pNew->fSmtLib = p->fSmtLib;
    pNew->fAsyncRst = p->fAsyncRst;
    pNew->fMemPorts = p->fMemPorts;
    pNew->fEasyFfs = p->fEasyFfs;
    Wlc_NtkForEachObj( p, pObj, i )
    {
        if ( Wlc_ObjIsCi(pObj) )
            continue;
        if ( pObj->Type == WLC_OBJ_ARI_MULTI )
            continue;
        if ( pObj->Type == WLC_OBJ_MUX && Wlc_ObjFaninNum(pObj) > 3 )
            continue;
        // create CIs for the fanins
        Wlc_ObjForEachFanin( pObj, iFanin, k )
        {
            pFanin = Wlc_NtkObj(p, iFanin);
            iFaninNew = Wlc_ObjAlloc( pNew, WLC_OBJ_PI, pFanin->Signed, pFanin->End, pFanin->Beg );
            pFaninNew = Wlc_NtkObj(pNew, iFaninNew);
            Wlc_ObjSetCopy( p, iFanin, iFaninNew );
            //Wlc_ObjSetCi( pNew, pFaninNew );
        }
        // create object
        iObjNew = Wlc_ObjDup( pNew, p, i, vFanins );
        pObjNew = Wlc_NtkObj(pNew, iObjNew);
        pObjNew->fIsPo = 1;
        Vec_IntPush( &pNew->vPos, iObjNew );
    }
    Vec_IntFree( vFanins );
    Wlc_NtkTransferNames( pNew, p );
    if ( p->pSpec )
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    return pNew;
}